

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O0

CKeyID * __thiscall CPubKey::GetID(CPubKey *this)

{
  long lVar1;
  Span<const_unsigned_char> *in_RSI;
  CKeyID *in_RDI;
  long in_FS_OFFSET;
  Span<const_unsigned_char> *in_stack_ffffffffffffff88;
  Span<const_unsigned_char> *in1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in1 = in_RSI;
  Span<const_unsigned_char>::Span<65>(in_stack_ffffffffffffff88,(uchar (*) [65])0x4afcce);
  size((CPubKey *)in_stack_ffffffffffffff88);
  Span<const_unsigned_char>::first(in_RSI,(size_t)in_RDI);
  Hash160<Span<unsigned_char_const>>(in1);
  CKeyID::CKeyID((CKeyID *)in_stack_ffffffffffffff88,(uint160 *)0x4afd13);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CKeyID GetID() const
    {
        return CKeyID(Hash160(Span{vch}.first(size())));
    }